

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O0

void __thiscall
slang::ast::DistExpression::serializeTo::anon_class_8_1_79d3bf50::operator()
          (anon_class_8_1_79d3bf50 *this,DistWeight *weight)

{
  int *in_RSI;
  char *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar1;
  size_t in_stack_ffffffffffffffa8;
  ASTSerializer *this_00;
  ASTSerializer *this_01;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc0;
  void *local_38;
  size_t local_30;
  int local_20;
  void *local_18;
  
  this_01 = *(ASTSerializer **)in_RDI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffc0,(char *)this_01);
  if (*in_RSI == 1) {
    bVar1 = sv(in_RDI,in_stack_ffffffffffffffa8);
    local_30 = bVar1._M_len;
  }
  else {
    bVar1 = sv(in_RDI,in_stack_ffffffffffffffa8);
    local_30 = bVar1._M_len;
  }
  ASTSerializer::write(this_01,local_20,local_18,local_30);
  this_00 = *(ASTSerializer **)in_RDI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffc0,(char *)this_01);
  ASTSerializer::write(this_00,(int)in_stack_ffffffffffffffc0,local_38,*(size_t *)(in_RSI + 2));
  return;
}

Assistant:

void DistExpression::serializeTo(ASTSerializer& serializer) const {
    auto writeWeight = [&](const DistWeight& weight) {
        serializer.write("kind", weight.kind == DistWeight::PerRange ? "PerRange"sv : "PerValue"sv);
        serializer.write("weight", *weight.expr);
    };

    serializer.write("left", left());
    serializer.startArray("items");
    for (auto& item : items_) {
        serializer.startObject();
        serializer.write("value", item.value);
        if (item.weight)
            writeWeight(*item.weight);
        serializer.endObject();
    }
    serializer.endArray();

    if (defaultWeight_) {
        serializer.writeProperty("defaultWeight");
        serializer.startObject();
        writeWeight(*defaultWeight_);
        serializer.endObject();
    }
}